

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void voc_count(voccxdef *ctx,objnum objn,prpnum prp,int *cnt,int *siz)

{
  undefined4 *in_RCX;
  undefined4 *in_R8;
  voc_count_ctx fnctx;
  
  voc_iterate(ctx,objn,(_func_void_void_ptr_vocdef_ptr_vocwdef_ptr *)cnt,siz);
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  return;
}

Assistant:

void voc_count(voccxdef *ctx, objnum objn, prpnum prp, int *cnt, int *siz)
{
    struct voc_count_ctx fnctx;

    /* set up the context with zero initial counts */
    fnctx.cnt = 0;
    fnctx.siz = 0;
    fnctx.prp = prp;

    /* iterate over all words for the object with our callback */
    voc_iterate(ctx, objn, voc_count_cb, &fnctx);

    /* return the data */
    if (cnt) *cnt = fnctx.cnt;
    if (siz) *siz = fnctx.siz;
}